

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestLocusPerpIntersect.cpp
# Opt level: O0

int TestLocusPerpIntercept(string *sFilePath)

{
  undefined8 uVar1;
  byte bVar2;
  bool bVar3;
  _Ios_Iostate __a;
  _Ios_Openmode _Var4;
  char *pcVar5;
  int nError;
  failure e;
  string local_2d8;
  string local_2b8;
  string local_298 [8];
  string sLine3;
  string sLine2;
  string sLine1;
  bool bPassed;
  int nCommentCount;
  int nCount;
  long local_220;
  ifstream infile;
  string *sFilePath_local;
  
  std::ifstream::ifstream(&local_220);
  uVar1 = *(undefined8 *)(local_220 + -0x18);
  __a = std::operator|(_S_eofbit,_S_failbit);
  std::operator|(__a,_S_badbit);
  std::ios::exceptions((int)&local_220 + (int)uVar1);
  sLine1.field_2._M_local_buf[0xb] = '\x01';
  std::__cxx11::string::string((string *)(sLine2.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(sLine3.field_2._M_local_buf + 8));
  std::__cxx11::string::string(local_298);
  _Var4 = std::__cxx11::string::c_str();
  std::ifstream::open((char *)&local_220,_Var4);
  while (bVar2 = std::ios::eof(), ((bVar2 ^ 0xff) & 1) != 0) {
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)&local_220,(string *)(sLine2.field_2._M_local_buf + 8));
    pcVar5 = (char *)std::__cxx11::string::at((ulong)((long)&sLine2.field_2 + 8));
    if (*pcVar5 != '#') {
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)&local_220,(string *)(sLine3.field_2._M_local_buf + 8));
      std::__cxx11::string::string((string *)&local_2b8,(string *)(sLine2.field_2._M_local_buf + 8))
      ;
      std::__cxx11::string::string((string *)&local_2d8,(string *)(sLine3.field_2._M_local_buf + 8))
      ;
      bVar3 = ParseLocusPerpIntercept(&local_2b8,&local_2d8);
      std::__cxx11::string::~string((string *)&local_2d8);
      std::__cxx11::string::~string((string *)&local_2b8);
      if (((bVar3 ^ 0xffU) & 1) != 0) {
        sLine1.field_2._M_local_buf[0xb] = '\0';
      }
    }
  }
  std::ifstream::close();
  std::__cxx11::string::~string(local_298);
  std::__cxx11::string::~string((string *)(sLine3.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(sLine2.field_2._M_local_buf + 8));
  std::ifstream::~ifstream(&local_220);
  return (uint)(byte)sLine1.field_2._M_local_buf[0xb];
}

Assistant:

int TestLocusPerpIntercept(const string &sFilePath)
{
    ifstream infile;
    infile.exceptions(ifstream::eofbit | ifstream::failbit | ifstream::badbit);
    int nCount = 0;
    int nCommentCount = 0;
    bool bPassed = true;
    try
    {
        string sLine1, sLine2, sLine3;
        infile.open(sFilePath.c_str(), ifstream::in);

        while (!infile.eof())
        {
            getline(infile, sLine1);
            if (sLine1.at(0) == '#')
            {
                nCommentCount++;
            }
            else
            {
                getline(infile, sLine2);
                if (!ParseLocusPerpIntercept(sLine1, sLine2))
                    bPassed = false;
                nCount++;
            }
        }
        infile.close();
        return bPassed;
    }

    catch (ifstream::failure e)
    {
        int nError = -99;
        // Per C++ standards for ifstream::failbit with global function getline
        // No characters were extracted because the end was prematurely found.Notice
        // that some eofbit cases will also set failbit.
        // In this case the end of the file is read and causes both flags to be raised,
        // so this presumably means all the data has been read correctly.
        if ((infile.rdstate() & ifstream::failbit) && (infile.rdstate() & ifstream::eofbit) != 0)
            nError = bPassed;
        else if ((infile.rdstate() & ifstream::failbit) != 0)
            nError = -1;
        else if ((infile.rdstate() & ifstream::badbit) != 0)
            nError = -2;
        else if ((infile.rdstate() & ifstream::eofbit) != 0)
            nError = -3;
        if (infile.is_open())
            infile.close();
        return nError;
    }
}